

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

int json::anon_unknown_1::isspace(int param_1)

{
  int iVar1;
  
  iVar1 = ::isspace(param_1);
  return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 != 0);
}

Assistant:

bool isspace(const char c)
    {
#ifdef CHAISCRIPT_MSVC
      // MSVC warns on these line in some circumstances
#pragma warning(push)
#pragma warning(disable : 6330)
#endif
      return ::isspace(c) != 0;
#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif


    }